

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int __thiscall MlmWrap::initialize(MlmWrap *this)

{
  bool bVar1;
  ostream *poVar2;
  zactor_t *pzVar3;
  void *in_RDI;
  TrodesMsg configReq;
  network_pimpl *in_stack_fffffffffffffe18;
  TrodesMsg *in_stack_fffffffffffffe20;
  allocator *paVar4;
  char *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  TrodesMsg *in_stack_fffffffffffffe60;
  allocator local_189;
  string local_188 [32];
  string local_168 [24];
  string *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  TrodesMsg *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed4;
  string *in_stack_fffffffffffffed8;
  MlmWrap *in_stack_fffffffffffffee0;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [79];
  allocator local_81;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  MlmWrap *in_stack_ffffffffffffff90;
  string local_60 [48];
  string local_30;
  int local_4;
  
  if ((*(byte *)((long)in_RDI + 0x91) & 1) == 0) {
    in_stack_fffffffffffffe60 = (TrodesMsg *)std::__cxx11::string::c_str();
    in_stack_fffffffffffffe58 = &local_30;
    network_pimpl::getEndpoint_abi_cxx11_(in_stack_fffffffffffffe18);
    std::__cxx11::string::c_str();
    create(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string((string *)&local_30);
    if ((*(byte *)((long)in_RDI + 0x91) & 1) == 0) {
      paVar4 = &local_81;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff80,"Client could not be initialized!",paVar4);
      error((MlmWrap *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
            in_stack_fffffffffffffeb0);
      poVar2 = std::operator<<((ostream *)&std::cerr,local_60);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      return -1;
    }
  }
  if ((*(byte *)((long)in_RDI + 0x90) & 1) == 0) {
    pzVar3 = zactor_new(message_reactor_task,in_RDI);
    *(zactor_t **)((long)in_RDI + 0x40) = pzVar3;
    if ((*(long *)((long)in_RDI + 0x40) == 0) || (*(long *)((long)in_RDI + 0x30) == 0)) {
      if (*(long *)((long)in_RDI + 0x40) == 0) {
        paVar4 = &local_189;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_188,"Client could not be initialized!",paVar4);
        error((MlmWrap *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0);
        poVar2 = std::operator<<((ostream *)&std::cerr,local_168);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_168);
        std::__cxx11::string::~string(local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
        local_4 = -1;
      }
      else {
        zactor_destroy((zactor_t **)((long)in_RDI + 0x40));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffec0,"Client could not be initialized!",
                   (allocator *)&stack0xfffffffffffffebf);
        error((MlmWrap *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
              in_stack_fffffffffffffeb0);
        poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&stack0xfffffffffffffee0);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffebf);
        local_4 = -2;
      }
    }
    else {
      *(undefined1 *)((long)in_RDI + 0x90) = 1;
      bVar1 = std::operator!=(&in_stack_fffffffffffffe20->format,(char *)in_stack_fffffffffffffe18);
      if ((bVar1) &&
         (bVar1 = std::operator!=(&in_stack_fffffffffffffe20->format,
                                  (char *)in_stack_fffffffffffffe18), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"s",&local_d1);
        TrodesMsg::TrodesMsg<char_const*>
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        sendMessage(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
                    (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_f8,"infoConf",&local_f9);
        blockforreply(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4)
        ;
        std::__cxx11::string::~string(local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        TrodesMsg::~TrodesMsg(in_stack_fffffffffffffe20);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int MlmWrap::initialize(){
    if (!connected){ //if the broker could not be connected to, try again once
        create(id.c_str(), state->getEndpoint().c_str());
        if(!connected){
            std::cerr << error("Client could not be initialized!") << std::endl;
            return -1;
        }
    }

    if(initialized){
        return 0;
    }
    actor = zactor_new(&MlmWrap::message_reactor_task, this);
    if(actor && client){ //both actor and client must be successfully created
        initialized = true;
        if (id != TRODES_NETWORK_ID && id != BROKER_NETWORK_ID) {
            //Request from Trodes the current state object (events, hfdts, and others)
            TrodesMsg configReq("s", INFO_CONFIG);
            sendMessage(TRODES_NETWORK_ID, TRODES_INFO_REQ, configReq);
            blockforreply(INFO_CONFIG, 500);
        }
        return 0;
    }
    else if (actor != NULL) {
        zactor_destroy(&actor);
        std::cerr << error("Client could not be initialized!") << std::endl;
        return -2;
    }
    else{
        std::cerr << error("Client could not be initialized!") << std::endl;
        return -1;
    }
}